

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O1

wstring * get_one_regexp_literal_abi_cxx11_(wstring_view text)

{
  version vVar1;
  wostream *pwVar2;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar3;
  wstring *in_RDI;
  lexer l;
  wstring_view local_78;
  lexer local_68;
  
  vVar1 = tested_version();
  mjs::lexer::lexer(&local_68,&local_78,vVar1);
  mjs::lexer::get_regex_literal(&local_68);
  if (local_68.current_token_.type_ == eof) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>();
    mjs::token::destroy(&local_68.current_token_);
    return in_RDI;
  }
  pwVar2 = std::operator<<((wostream *)&std::wcerr,"get_one_regexp_literal");
  pwVar2 = std::operator<<(pwVar2," in ");
  pwVar2 = std::operator<<(pwVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                          );
  pwVar2 = std::operator<<(pwVar2,":");
  pwVar2 = (wostream *)std::wostream::operator<<((wostream *)pwVar2,0x8a);
  pwVar2 = std::operator<<(pwVar2,":\n");
  pwVar2 = std::operator<<(pwVar2,"!!(!l.current_token())");
  pwVar2 = std::operator<<(pwVar2," != ");
  pwVar2 = std::operator<<(pwVar2,"true");
  pwVar2 = std::operator<<(pwVar2,"\n");
  pwVar2 = std::wostream::_M_insert<bool>(SUB81(pwVar2,0));
  pwVar2 = std::operator<<(pwVar2," != ");
  pwVar2 = std::wostream::_M_insert<bool>(SUB81(pwVar2,0));
  pwVar2 = std::operator<<(pwVar2,"\n");
  vVar1 = tested_version();
  pbVar3 = mjs::operator<<(pwVar2,vVar1);
  std::operator<<(pbVar3,"\n");
  abort();
}

Assistant:

std::wstring get_one_regexp_literal(std::wstring_view text) {
    lexer l{text, tested_version()};
    const auto regex_lit = l.get_regex_literal();
    REQUIRE(!l.current_token()); // Must be at end
    return std::wstring{regex_lit};
}